

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int pmbtoken_generate_key(PMBTOKEN_METHOD *method,CBB *out_private,CBB *out_public)

{
  int iVar1;
  undefined1 local_1d8 [8];
  EC_SCALAR ys;
  EC_SCALAR xs;
  EC_SCALAR y1;
  EC_SCALAR x1;
  EC_SCALAR y0;
  EC_SCALAR x0;
  CBB *out_public_local;
  CBB *out_private_local;
  PMBTOKEN_METHOD *method_local;
  
  iVar1 = ec_random_nonzero_scalar(method->group,(EC_SCALAR *)(y0.words + 8),"");
  if ((((iVar1 != 0) &&
       (iVar1 = ec_random_nonzero_scalar(method->group,(EC_SCALAR *)(x1.words + 8),""), iVar1 != 0))
      && (iVar1 = ec_random_nonzero_scalar(method->group,(EC_SCALAR *)(y1.words + 8),""), iVar1 != 0
         )) && (((iVar1 = ec_random_nonzero_scalar(method->group,(EC_SCALAR *)(xs.words + 8),""),
                 iVar1 != 0 &&
                 (iVar1 = ec_random_nonzero_scalar(method->group,(EC_SCALAR *)(ys.words + 8),""),
                 iVar1 != 0)) &&
                (iVar1 = ec_random_nonzero_scalar(method->group,(EC_SCALAR *)local_1d8,""),
                iVar1 != 0)))) {
    iVar1 = pmbtoken_compute_keys
                      (method,out_private,out_public,(EC_SCALAR *)(y0.words + 8),
                       (EC_SCALAR *)(x1.words + 8),(EC_SCALAR *)(y1.words + 8),
                       (EC_SCALAR *)(xs.words + 8),(EC_SCALAR *)(ys.words + 8),
                       (EC_SCALAR *)local_1d8);
    return iVar1;
  }
  ERR_put_error(0x20,0,100,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                ,0xeb);
  return 0;
}

Assistant:

static int pmbtoken_generate_key(const PMBTOKEN_METHOD *method,
                                 CBB *out_private, CBB *out_public) {
  EC_SCALAR x0, y0, x1, y1, xs, ys;
  if (!ec_random_nonzero_scalar(method->group, &x0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &y0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &x1, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &y1, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &xs, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &ys, kDefaultAdditionalData)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_KEYGEN_FAILURE);
    return 0;
  }

  return pmbtoken_compute_keys(method, out_private, out_public, &x0, &y0, &x1,
                               &y1, &xs, &ys);
}